

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::_q_yearClicked(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FocusPolicy FVar5;
  QWidget *this_01;
  long in_FS_OFFSET;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QWidget *)this->yearEdit;
  iVar2 = QWidget::x((QWidget *)this->yearButton);
  iVar3 = QWidget::y((QWidget *)this->yearButton);
  iVar4 = (**(code **)(*(long *)&(this->yearEdit->super_QAbstractSpinBox).super_QWidget + 0x70))();
  pQVar1 = (this->yearButton->super_QToolButton).super_QAbstractButton.super_QWidget.data;
  local_40.y2.m_i = ((pQVar1->crect).y2.m_i + iVar3) - (pQVar1->crect).y1.m_i;
  local_40.x2.m_i = iVar4 + iVar2 + -1;
  local_40.x1.m_i = iVar2;
  local_40.y1.m_i = iVar3;
  QWidget::setGeometry(this_00,&local_40);
  pQVar1 = (this->yearButton->super_QToolButton).super_QAbstractButton.super_QWidget.data;
  QSpacerItem::changeSize
            (this->spaceHolder,((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1,0,Minimum,
             Minimum);
  QWidget::hide((QWidget *)this->yearButton);
  FVar5 = QWidget::focusPolicy(this_01);
  this->oldFocusPolicy = FVar5;
  QWidget::setFocusPolicy(this_01,NoFocus);
  QWidget::show((QWidget *)this->yearEdit);
  QObject::installEventFilter(QCoreApplication::self);
  QWidget::raise((QWidget *)this->yearEdit,(int)this_01);
  QAbstractSpinBox::selectAll((QAbstractSpinBox *)this->yearEdit);
  QWidget::setFocus((QWidget *)this->yearEdit,MouseFocusReason);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_yearClicked()
{
    Q_Q(QCalendarWidget);
    //show the spinbox on top of the button
    yearEdit->setGeometry(yearButton->x(), yearButton->y(),
                          yearEdit->sizeHint().width(), yearButton->height());
    spaceHolder->changeSize(yearButton->width(), 0);
    yearButton->hide();
    oldFocusPolicy = q->focusPolicy();
    q->setFocusPolicy(Qt::NoFocus);
    yearEdit->show();
    qApp->installEventFilter(q);
    yearEdit->raise();
    yearEdit->selectAll();
    yearEdit->setFocus(Qt::MouseFocusReason);
}